

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

FederateState * __thiscall
helics::CommonCore::getHandleFederate(CommonCore *this,InterfaceHandle handle)

{
  long lVar1;
  LocalFederateId LVar2;
  FederateState *pFVar3;
  handle feds;
  undefined1 local_30 [8];
  unique_lock<std::shared_mutex> local_28;
  
  local_30 = (undefined1  [8])&(this->handles).m_mutex;
  local_28._M_device._0_1_ = true;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)local_30);
  LVar2 = HandleManager::getLocalFedID(&(this->handles).m_obj,handle);
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_30);
  if (LVar2.fid == -2000000000) {
    pFVar3 = (FederateState *)0x0;
  }
  else {
    gmlc::libguarded::
    shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::lock((handle *)local_30,&this->federates);
    lVar1 = (((__shared_mutex_pthread *)local_30)->_M_rwlock).__align;
    if ((ulong)(long)LVar2.fid <
        (ulong)(*(long *)((long)&((__shared_mutex_pthread *)local_30)->_M_rwlock + 8) - lVar1 >> 3))
    {
      pFVar3 = *(FederateState **)(lVar1 + (long)LVar2.fid * 8);
    }
    else {
      pFVar3 = (FederateState *)0x0;
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_28);
  }
  return pFVar3;
}

Assistant:

FederateState* CommonCore::getHandleFederate(InterfaceHandle handle)
{
    auto local_fed_id = handles.read([handle](auto& hand) { return hand.getLocalFedID(handle); });
    if (local_fed_id.isValid()) {
        auto feds = federates.lock();
        return (*feds)[local_fed_id.baseValue()];
    }

    return nullptr;
}